

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int acmod_process_feat(acmod_t *acmod,mfcc_t **feat)

{
  feat_t *pfVar1;
  uint32 *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_frame * 2);
  }
  iVar6 = acmod->n_feat_frame + acmod->feat_outidx;
  if (acmod->grow_feat == '\0') {
    iVar6 = iVar6 % acmod->n_feat_alloc;
  }
  else {
    while (acmod->n_feat_alloc <= iVar6 + 1) {
      acmod_grow_feat_buf(acmod,acmod->n_feat_alloc * 2);
    }
  }
  lVar4 = 0;
  lVar5 = 0;
  while( true ) {
    pfVar1 = acmod->fcb;
    iVar3 = pfVar1->n_sv;
    if (iVar3 == 0) {
      iVar3 = pfVar1->n_stream;
    }
    if (iVar3 <= lVar5) break;
    if (pfVar1->lda == (mfcc_t ***)0x0) {
      if (pfVar1->sv_len == (uint32 *)0x0) {
        puVar2 = (uint32 *)((long)pfVar1->stream_len + lVar4);
      }
      else {
        puVar2 = pfVar1->sv_len + lVar5;
      }
    }
    else {
      puVar2 = &pfVar1->out_dim;
    }
    memcpy(*(void **)((long)acmod->feat_buf[iVar6] + lVar4 * 2),*(void **)((long)feat + lVar4 * 2),
           (ulong)*puVar2 << 2);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 4;
  }
  iVar6 = acmod->n_feat_frame;
  acmod->n_feat_frame = iVar6 + 1;
  if (iVar6 < acmod->n_feat_alloc) {
    return 1;
  }
  __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0x317,"int acmod_process_feat(acmod_t *, mfcc_t **)");
}

Assistant:

int
acmod_process_feat(acmod_t *acmod,
                   mfcc_t **feat)
{
    int i, inptr;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (acmod->grow_feat) {
        /* Grow to avoid wraparound if grow_feat == TRUE. */
        inptr = acmod->feat_outidx + acmod->n_feat_frame;
        while (inptr + 1 >= acmod->n_feat_alloc)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
    }
    else {
        inptr = (acmod->feat_outidx + acmod->n_feat_frame) % acmod->n_feat_alloc;
    }
    for (i = 0; i < feat_dimension1(acmod->fcb); ++i)
        memcpy(acmod->feat_buf[inptr][i],
               feat[i], feat_dimension2(acmod->fcb, i) * sizeof(**feat));
    ++acmod->n_feat_frame;
    assert(acmod->n_feat_frame <= acmod->n_feat_alloc);

    return 1;
}